

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::AdvancedPipelineComputeChain::Run(AdvancedPipelineComputeChain *this)

{
  CallLogWrapper *this_00;
  GLuint *pGVar1;
  float *pfVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [16];
  bool bVar10;
  int i_2;
  GLuint GVar11;
  GLint GVar12;
  void *pvVar13;
  tcu *this_01;
  ComputeShaderBase *epsilon;
  bool *extraout_RDX;
  bool *extraout_RDX_00;
  bool *compile_error;
  Matrix<float,_4,_4> *mat;
  Matrix<float,_4,_4> *extraout_RDX_01;
  Matrix<float,_4,_4> *extraout_RDX_02;
  Matrix<float,_4,_4> *mat_00;
  Matrix<float,_4,_4> *mat_01;
  int *piVar14;
  long lVar15;
  ulong uVar16;
  ComputeShaderBase *this_02;
  ulong uVar17;
  int i_1;
  long lVar18;
  GLuint i;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> data_3;
  vec4 local_218;
  GLuint *local_200;
  Matrix<float,_4,_4> local_1f8;
  stringstream ss;
  long lStack_1b0;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  piVar14 = &DAT_01749e2c;
  lVar18 = 0;
  while( true ) {
    if (lVar18 == 3) break;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&data_3,
               "\nprecision highp image2D;\nstruct S0 {\n  int m0[8];\n};\nstruct S1 {\n  S0 m0[8];\n};\nlayout(binding = 0, std430) buffer Buffer0 {\n  int m0[5];\n  S1 m1[8];\n} g_buffer0;\nlayout(binding = 1, std430) buffer Buffer1 {\n  uint data[8];\n} g_buffer1;\nlayout(binding = 2, std430) buffer Buffer2 {\n  int data[256];\n} g_buffer2;\nlayout(binding = 3, std430) buffer Buffer3 {\n  int data[256];\n} g_buffer3;\nlayout(binding = 4, std430) buffer Buffer4 {\n  mat4 data0;\n  mat4 data1;\n} g_buffer4;\nlayout(binding = 0, rgba8) writeonly uniform mediump image2D g_image0;\nlayout(binding = 0, offset = 8) uniform atomic_uint g_counter[2];"
               ,(allocator<char> *)&local_218);
    std::operator<<((ostream *)local_1a8,(string *)&data_3);
    std::__cxx11::string::~string((string *)&data_3);
    std::operator<<((ostream *)local_1a8,(char *)((long)&DAT_01749e2c + (long)*piVar14));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    GVar11 = ComputeShaderBase::CreateComputeProgram
                       (&this->super_ComputeShaderBase,(string *)&local_1f8);
    this->m_program[lVar18] = GVar11;
    std::__cxx11::string::~string((string *)&local_1f8);
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[lVar18]);
    if ((int)lVar18 == 1) {
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program[lVar18]);
      local_188 = 0x41a0000041200000;
      uStack_180 = 0x3f80000041f00000;
      local_198 = 0;
      uStack_190 = 0x3f800000;
      local_1a8 = ZEXT816(0x3f80000000000000);
      _ss = ZEXT816(0x3f800000);
      GVar12 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program[lVar18],"g_mvp");
      glu::CallLogWrapper::glUniformMatrix4fv(this_00,GVar12,1,'\0',(GLfloat *)&ss);
LAB_00c24a70:
      glu::CallLogWrapper::glUseProgram(this_00,0);
      compile_error = extraout_RDX_00;
    }
    else {
      compile_error = extraout_RDX;
      if ((int)lVar18 == 0) {
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[lVar18]);
        GVar12 = glu::CallLogWrapper::glGetUniformLocation
                           (this_00,this->m_program[lVar18],"g_add_value");
        glu::CallLogWrapper::glUniform1i(this_00,GVar12,1);
        GVar12 = glu::CallLogWrapper::glGetUniformLocation
                           (this_00,this->m_program[lVar18],"g_counter_y");
        glu::CallLogWrapper::glUniform1ui(this_00,GVar12,1);
        GVar12 = glu::CallLogWrapper::glGetUniformLocation
                           (this_00,this->m_program[lVar18],"g_image_value");
        glu::CallLogWrapper::glUniform4f(this_00,GVar12,0.25,0.5,0.75,1.0);
        goto LAB_00c24a70;
      }
    }
    bVar10 = ComputeShaderBase::CheckProgram
                       (&this->super_ComputeShaderBase,this->m_program[lVar18],compile_error);
    lVar18 = lVar18 + 1;
    piVar14 = piVar14 + 1;
    if (!bVar10) {
      return -1;
    }
  }
  glu::CallLogWrapper::glGenBuffers(this_00,4,this->m_storage_buffer);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&ss,0x205,(allocator_type *)&data_3);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,lStack_1b0 - (long)_ss,_ss,0x88e6);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ss);
  local_1a8 = (undefined1  [16])0x0;
  _ss = (undefined1  [16])0x0;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x20,&ss,0x88e6);
  data_3.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 7;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&ss,0x200,(value_type_conflict1 *)&data_3,
             (allocator_type *)&local_1f8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,lStack_1b0 - (long)_ss,_ss,0x88e6);
  glu::CallLogWrapper::glBindBufferRange
            (this_00,0x90d2,2,this->m_storage_buffer[2],0,
             (ulong)(lStack_1b0 - (long)_ss) >> 1 & 0xfffffffffffffffe);
  uVar17 = (ulong)(lStack_1b0 - (long)_ss) >> 1 & 0x7ffffffffffffffe;
  glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,3,this->m_storage_buffer[2],uVar17,uVar17);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ss);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (&data_3,2,(allocator_type *)&ss);
  local_1f8.m_data.m_data[0].m_data[0] = 1.0;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&ss,(float *)&local_1f8);
  tcu::Matrix<float,_4,_4>::operator=
            ((Matrix<float,_4,_4> *)
             CONCAT44(data_3.
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      data_3.
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_),(Matrix<float,_4,_4> *)&ss);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[3]);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,
             (long)data_3.
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)CONCAT44(data_3.
                            super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            data_3.
                            super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_),
             (void *)CONCAT44(data_3.
                              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              data_3.
                              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_),0x88e6);
  std::_Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
  ~_Vector_base(&data_3.
                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               );
  _ss = (undefined1  [16])0x0;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_counter_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->m_counter_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x10,&ss,0x88e6);
  data_3.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&ss,0x40,(value_type_conflict1 *)&data_3,
             (allocator_type *)&local_1f8);
  pGVar1 = &this->m_texture;
  glu::CallLogWrapper::glGenTextures(this_00,1,pGVar1);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*pGVar1);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8058,4,4);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0,0,4,4,0x1908,0x1401,_ss);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  local_200 = pGVar1;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ss);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_texture,0,'\0',0,0x88ba,0x8058);
  glu::CallLogWrapper::glDispatchCompute(this_00,2,2,2);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x2020);
  glu::CallLogWrapper::glDispatchCompute(this_00,3,2,2);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
  glu::CallLogWrapper::glDispatchCompute(this_00,4,3,7);
  glu::CallLogWrapper::glMemoryBarrier(this_00,800);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
  pvVar13 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x814,1);
  lVar18 = 0;
  for (lVar15 = 0; lVar15 != 0x200; lVar15 = lVar15 + 1) {
    uVar3 = *(uint *)((long)pvVar13 + lVar15 * 4 + 0x14);
    if (uVar3 != 4) {
      anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uVar3,2);
      lVar18 = -1;
    }
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
  pvVar13 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x20,1);
  for (uVar17 = 0; uVar17 != 4; uVar17 = uVar17 + 1) {
    uVar16 = (ulong)*(uint *)((long)pvVar13 + uVar17 * 4);
    if (uVar17 != uVar16) {
      anon_unknown_0::Output("Data is: %d should be: %d.\n",uVar16,uVar17 & 0xffffffff);
      lVar18 = -1;
    }
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
  pvVar13 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x800,1);
  lVar15 = 0;
  while( true ) {
    if (lVar15 == 2) break;
    uVar3 = *(uint *)((long)pvVar13 + lVar15 * 4);
    if (uVar3 != 5) {
      anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uVar3,5);
      lVar18 = -1;
    }
    uVar3 = *(uint *)((long)pvVar13 + lVar15 * 4 + 0x400);
    if (uVar3 != 7) {
      anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uVar3,7);
      lVar18 = -1;
    }
    lVar15 = lVar15 + 1;
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
  this_01 = (tcu *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x80,1);
  tcu::transpose<float,4,4>((Matrix<float,_4,_4> *)&ss,this_01 + 0x40,mat);
  local_1f8.m_data.m_data[0].m_data._0_8_ = (pointer)0x41a0000041200000;
  local_1f8.m_data.m_data[0].m_data[2] = 30.0;
  tcu::translationMatrix<float,_3>((Matrix<float,_4,_4> *)&data_3,(Vector<float,_3> *)&local_1f8);
  bVar10 = tcu::operator!=((Matrix<float,_4,_4> *)&ss,(Matrix<float,_4,_4> *)&data_3);
  mat_00 = extraout_RDX_01;
  if (bVar10) {
    anon_unknown_0::Output("Data is incorrect.\n");
    lVar18 = -1;
    mat_00 = extraout_RDX_02;
  }
  tcu::transpose<float,4,4>((Matrix<float,_4,_4> *)&ss,this_01,mat_00);
  local_218.m_data[0] = 10.0;
  local_218.m_data[1] = 20.0;
  local_218.m_data[2] = 30.0;
  tcu::translationMatrix<float,_3>(&local_1f8,(Vector<float,_3> *)&local_218);
  tcu::transpose<float,4,4>((Matrix<float,_4,_4> *)&data_3,(tcu *)&local_1f8,mat_01);
  pGVar1 = local_200;
  bVar10 = tcu::operator!=((Matrix<float,_4,_4> *)&ss,(Matrix<float,_4,_4> *)&data_3);
  if (bVar10) {
    anon_unknown_0::Output("Data is incorrect.\n");
    lVar18 = -1;
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  pvVar13 = glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,0x10,1);
  if (*(uint *)((long)pvVar13 + 0xc) != 4) {
    anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)*(uint *)((long)pvVar13 + 0xc),4);
    lVar18 = -1;
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&ss,0x10,
             (allocator_type *)&data_3);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*pGVar1);
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->m_fbo);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,*pGVar1,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_3,0x40,
             (allocator_type *)&local_1f8);
  epsilon = (ComputeShaderBase *)
            CONCAT44(data_3.
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                     data_3.
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_4_);
  glu::CallLogWrapper::glReadPixels(this_00,0,0,4,4,0x1908,0x1401,epsilon);
  auVar9 = _DAT_0167ea80;
  for (uVar17 = 0; uVar17 < 0x40; uVar17 = uVar17 + 4) {
    uVar4 = *(undefined4 *)
             (CONCAT44(data_3.
                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       data_3.
                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar17);
    uVar16 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar16;
    auVar5[0xc] = (char)((uint)uVar4 >> 0x18);
    auVar6[8] = (char)((uint)uVar4 >> 0x10);
    auVar6._0_8_ = uVar16;
    auVar6[9] = 0;
    auVar6._10_3_ = auVar5._10_3_;
    auVar8._5_8_ = 0;
    auVar8._0_5_ = auVar6._8_5_;
    auVar7[4] = (char)((uint)uVar4 >> 8);
    auVar7._0_4_ = (int)uVar16;
    auVar7[5] = 0;
    auVar7._6_7_ = SUB137(auVar8 << 0x40,6);
    auVar20._0_8_ = (double)(int)uVar16;
    auVar20._8_8_ = (double)auVar7._4_4_;
    auVar19._0_8_ = (double)auVar6._8_4_;
    auVar19._8_8_ = (double)(uint3)(auVar5._10_3_ >> 0x10);
    auVar19 = divpd(auVar19,auVar9);
    auVar20 = divpd(auVar20,auVar9);
    pfVar2 = (_ss->g_color_eps).m_data + (uVar17 - 0xe);
    *(ulong *)pfVar2 = CONCAT44((float)auVar20._8_8_,(float)auVar20._0_8_);
    *(ulong *)(pfVar2 + 2) = CONCAT44((float)auVar19._8_8_,(float)auVar19._0_8_);
    epsilon = _ss;
  }
  local_1f8.m_data.m_data[0].m_data._0_8_ = (pointer)0x3b8080813b808081;
  local_1f8.m_data.m_data[0].m_data[2] = 0.003921569;
  local_1f8.m_data.m_data[0].m_data[3] = 0.003921569;
  lVar15 = (lStack_1b0 - (long)_ss >> 4) + 1;
  this_02 = _ss;
  do {
    lVar15 = lVar15 + -1;
    if (lVar15 == 0) goto LAB_00c252a5;
    local_218.m_data[0] = 0.25;
    local_218.m_data[1] = 0.5;
    local_218.m_data[2] = 0.75;
    local_218.m_data[3] = 1.0;
    bVar10 = ComputeShaderBase::ColorEqual(this_02,&local_218,(vec4 *)&local_1f8,(vec4 *)epsilon);
    this_02 = (ComputeShaderBase *)
              &(this_02->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_log;
  } while (bVar10);
  anon_unknown_0::Output("Invalid data at texture.\n");
  lVar18 = -1;
LAB_00c252a5:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data_3);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&ss);
  return lVar18;
}

Assistant:

virtual long Run()
	{
		using namespace tcu;

		for (int i = 0; i < 3; ++i)
		{
			m_program[i] = CreateComputeProgram(GenGLSL(i));
			glLinkProgram(m_program[i]);
			if (i == 0)
			{
				glUseProgram(m_program[i]);
				glUniform1i(glGetUniformLocation(m_program[i], "g_add_value"), 1);
				glUniform1ui(glGetUniformLocation(m_program[i], "g_counter_y"), 1u);
				glUniform4f(glGetUniformLocation(m_program[i], "g_image_value"), 0.25f, 0.5f, 0.75f, 1.0f);
				glUseProgram(0);
			}
			else if (i == 1)
			{
				glUseProgram(m_program[i]);
				GLfloat values[16] = { 1.0f, 0.0f, 0.0f, 0.0f, 0.0f,  1.0f,  0.0f,  0.0f,
									   0.0f, 0.0f, 1.0f, 0.0f, 10.0f, 20.0f, 30.0f, 1.0f };
				glUniformMatrix4fv(glGetUniformLocation(m_program[i], "g_mvp"), 1, GL_FALSE, values);
				glUseProgram(0);
			}
			if (!CheckProgram(m_program[i]))
				return ERROR;
		}

		glGenBuffers(4, m_storage_buffer);
		/* storage buffer 0 */
		{
			std::vector<int> data(5 + 8 * 8 * 8);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(int)), &data[0], GL_STATIC_COPY);
		}
		/* storage buffer 1 */
		{
			const GLuint data[8] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* storage buffer 2 & 3 */
		{
			std::vector<GLint> data(512, 7);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(GLint)), &data[0], GL_STATIC_COPY);

			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2], 0,
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[2],
							  (GLintptr)(sizeof(GLint) * data.size() / 2),
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
		}
		/* storage buffer 4 */
		{
			std::vector<mat4> data(2);
			data[0] = mat4(1);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(mat4)), &data[0], GL_STATIC_COPY);
		}
		/* counter buffer */
		{
			GLuint data[4] = { 0 };
			glGenBuffers(1, &m_counter_buffer);
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_counter_buffer);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* texture */
		{
			std::vector<GLint> data(4 * 4 * 4, 0);
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 4, 4);
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glUseProgram(m_program[0]);
		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA8);
		glDispatchCompute(2, 2, 2);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT | GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(3, 2, 2);

		glUseProgram(m_program[1]);
		glDispatchCompute(4, 3, 7);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT | GL_TEXTURE_UPDATE_BARRIER_BIT |
						GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		long error = NO_ERROR;
		/* validate storage buffer 0 */
		{
			int* data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			data = static_cast<int*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int) * (5 + 8 * 8 * 8), GL_MAP_READ_BIT));
			for (std::size_t i = 5; i < 5 + 8 * 8 * 8; ++i)
			{
				if (data[i] != 4)
				{
					Output("Data is: %d should be: %d.\n", data[i], 2);
					error = ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		/* validate storage buffer 1 */
		{
			GLuint* data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			data = static_cast<GLuint*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * 8, GL_MAP_READ_BIT));
			for (GLuint i = 0; i < 4; ++i)
			{
				if (data[i] != i)
				{
					Output("Data is: %d should be: %d.\n", data[i], i);
					error = ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		/* validate storage buffer 2 & 3 */
		{
			GLint* data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			data = static_cast<GLint*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLint) * 512, GL_MAP_READ_BIT));
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != 5)
				{
					Output("Data is: %d should be: %d.\n", data[i], 5);
					error = ERROR;
				}
				if (data[i + 256] != 7)
				{
					Output("Data is: %d should be: %d.\n", data[i + 256], 7);
					error = ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		/* validate storage buffer 4 */
		{
			mat4* data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			data = static_cast<mat4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(mat4) * 2, GL_MAP_READ_BIT));
			if (transpose(data[1]) != translationMatrix(vec3(10.0f, 20.0f, 30.0f)))
			{
				Output("Data is incorrect.\n");
				error = ERROR;
			}
			if (transpose(data[0]) != transpose(translationMatrix(vec3(10.0f, 20.0f, 30.0f))))
			{
				Output("Data is incorrect.\n");
				error = ERROR;
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		/* validate counter buffer */
		{
			GLuint* data;
			data = static_cast<GLuint*>(
				glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(GLuint) * 4, GL_MAP_READ_BIT));
			if (data[3] != 4)
			{
				Output("Data is: %d should be: %d.\n", data[3], 4);
				error = ERROR;
			}
			glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		}
		/* validate texture */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glGenFramebuffers(1, &m_fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
			std::vector<GLubyte> colorData(4 * 4 * 4);
			glReadPixels(0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
			for (int i = 0; i < 4 * 4 * 4; i += 4)
			{
				data[i / 4] =
					vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
						 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
			}
			vec4 epsilon = vec4(1.0f / 255.0f, 1.0f / 255.0f, 1.0f / 255.0f, 1.0f / 255.0f); // texture format is RGBA8.
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!ColorEqual(data[i], vec4(0.25f, 0.5f, 0.75f, 1.0f), epsilon))
				{
					Output("Invalid data at texture.\n");
					return ERROR;
				}
			}
		}

		return error;
	}